

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

Abc_Obj_t * Abc_NtkAddLatch(Abc_Ntk_t *pNtk,Abc_Obj_t *pDriver,Abc_InitType_t Init)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  char *pcVar1;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar2;
  
  pObj = Abc_NtkCreateBo(pNtk);
  pObj_00 = Abc_NtkCreateLatch(pNtk);
  pObj_01 = Abc_NtkCreateBi(pNtk);
  pcVar1 = Abc_ObjName(pObj_00);
  Abc_ObjAssignName(pObj,pcVar1,"_lo");
  pcVar1 = Abc_ObjName(pObj_00);
  Abc_ObjAssignName(pObj_01,pcVar1,"_li");
  Abc_ObjAddFanin(pObj,pObj_00);
  Abc_ObjAddFanin(pObj_00,pObj_01);
  if (pDriver != (Abc_Obj_t *)0x0) {
    Abc_ObjAddFanin(pObj_01,pDriver);
  }
  aVar2._4_4_ = 0;
  aVar2.iData = Init;
  pObj_00->field_5 = aVar2;
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkAddLatch( Abc_Ntk_t * pNtk, Abc_Obj_t * pDriver, Abc_InitType_t Init )
{
    Abc_Obj_t * pLatchOut, * pLatch, * pLatchIn;
    pLatchOut = Abc_NtkCreateBo(pNtk);
    pLatch    = Abc_NtkCreateLatch(pNtk);
    pLatchIn  = Abc_NtkCreateBi(pNtk);
    Abc_ObjAssignName( pLatchOut, Abc_ObjName(pLatch), "_lo" );
    Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pLatch), "_li" );
    Abc_ObjAddFanin( pLatchOut, pLatch );
    Abc_ObjAddFanin( pLatch, pLatchIn );
    if ( pDriver )
    Abc_ObjAddFanin( pLatchIn, pDriver );
    pLatch->pData = (void *)Init;
    return pLatchOut;
}